

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# issue200_test.cc
# Opt level: O1

void __thiscall leveldb::Issue200_Test_Test::~Issue200_Test_Test(Issue200_Test_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(Issue200, Test) {
  // Get rid of any state from an old run.
  std::string dbpath = testing::TempDir() + "leveldb_issue200_test";
  DestroyDB(dbpath, Options());

  DB* db;
  Options options;
  options.create_if_missing = true;
  ASSERT_LEVELDB_OK(DB::Open(options, dbpath, &db));

  WriteOptions write_options;
  ASSERT_LEVELDB_OK(db->Put(write_options, "1", "b"));
  ASSERT_LEVELDB_OK(db->Put(write_options, "2", "c"));
  ASSERT_LEVELDB_OK(db->Put(write_options, "3", "d"));
  ASSERT_LEVELDB_OK(db->Put(write_options, "4", "e"));
  ASSERT_LEVELDB_OK(db->Put(write_options, "5", "f"));

  ReadOptions read_options;
  Iterator* iter = db->NewIterator(read_options);

  // Add an element that should not be reflected in the iterator.
  ASSERT_LEVELDB_OK(db->Put(write_options, "25", "cd"));

  iter->Seek("5");
  ASSERT_EQ(iter->key().ToString(), "5");
  iter->Prev();
  ASSERT_EQ(iter->key().ToString(), "4");
  iter->Prev();
  ASSERT_EQ(iter->key().ToString(), "3");
  iter->Next();
  ASSERT_EQ(iter->key().ToString(), "4");
  iter->Next();
  ASSERT_EQ(iter->key().ToString(), "5");

  delete iter;
  delete db;
  DestroyDB(dbpath, options);
}